

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeAtomicCmpxchg
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,uint bytes,Address offset,
          Type type,Name mem)

{
  undefined8 *puVar1;
  AtomicCmpxchg *this_00;
  optional<wasm::Type> type_00;
  AtomicCmpxchg local_e0;
  Expression *local_98;
  Expression *pEStack_90;
  undefined1 local_88 [8];
  Result<wasm::Ok> _val;
  ChildPopper local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  Function *pFStack_40;
  uint local_34;
  
  local_e0.super_SpecificExpression<(wasm::Expression::Id)25>.super_Expression._id = AtomicCmpxchgId
  ;
  local_e0.super_SpecificExpression<(wasm::Expression::Id)25>.super_Expression.type.id = 0;
  local_e0.offset.addr = 0;
  local_e0.memory.super_IString.str._M_len = mem.super_IString.str._M_len;
  local_e0.memory.super_IString.str._M_str = mem.super_IString.str._M_str;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 1;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)type.id;
  local_58.builder = this;
  local_34 = bytes;
  ChildPopper::visitAtomicCmpxchg((Result<wasm::Ok> *)local_88,&local_58,&local_e0,type_00);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    local_58.builder = (IRBuilder *)&stack0xffffffffffffffb8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_88,
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_88);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    if (local_58.builder == (IRBuilder *)&stack0xffffffffffffffb8) {
      *puVar1 = CONCAT71(uStack_47,local_48);
      *(Function **)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = pFStack_40;
    }
    else {
      *(IRBuilder **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_58.builder;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           CONCAT71(uStack_47,local_48);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_50;
    local_50 = 0;
    local_48 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    local_58.builder = (IRBuilder *)&stack0xffffffffffffffb8;
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
    _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _32_8_ = local_e0.replacement;
    local_98 = local_e0.ptr;
    pEStack_90 = local_e0.expected;
    this_00 = (AtomicCmpxchg *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x48,8);
    *(undefined8 *)&(this_00->super_SpecificExpression<(wasm::Expression::Id)25>).super_Expression =
         0;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)25>).super_Expression.type.id = 0;
    this_00->replacement = (Expression *)0x0;
    (this_00->memory).super_IString.str._M_len = 0;
    *(undefined8 *)&this_00->bytes = 0;
    (this_00->offset).addr = 0;
    (this_00->memory).super_IString.str._M_str = (char *)0x0;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)25>).super_Expression._id =
         AtomicCmpxchgId;
    (this_00->memory).super_IString.str._M_len = 0;
    (this_00->memory).super_IString.str._M_str = (char *)0x0;
    this_00->bytes = (uint8_t)local_34;
    (this_00->offset).addr = offset.addr;
    this_00->ptr = local_98;
    this_00->expected = pEStack_90;
    this_00->replacement =
         (Expression *)
         _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>
         .super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)25>).super_Expression.type.id = type.id
    ;
    AtomicCmpxchg::finalize(this_00);
    (this_00->memory).super_IString.str._M_len = mem.super_IString.str._M_len;
    (this_00->memory).super_IString.str._M_str = mem.super_IString.str._M_str;
    push(this,(Expression *)this_00);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeAtomicCmpxchg(unsigned bytes,
                                      Address offset,
                                      Type type,
                                      Name mem) {
  AtomicCmpxchg curr;
  curr.memory = mem;
  CHECK_ERR(ChildPopper{*this}.visitAtomicCmpxchg(&curr, type));
  push(builder.makeAtomicCmpxchg(
    bytes, offset, curr.ptr, curr.expected, curr.replacement, type, mem));
  return Ok{};
}